

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bin.cpp
# Opt level: O0

void SolveFile(string *file)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  reference pFVar4;
  iterator iVar5;
  iterator iVar6;
  char *pcVar7;
  reference pCVar8;
  long lVar9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  ostream *poVar10;
  ostream local_6a8 [8];
  ofstream fout;
  allocator local_491;
  string local_490 [8];
  string remainingFile;
  string local_470 [8];
  string finalFile;
  Class local_450;
  undefined1 local_3d0 [40];
  Class itr_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Class,_std::allocator<Class>_> *__range1_1;
  string local_2f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8 [32];
  int local_2b8;
  int local_2b4;
  int i;
  int start;
  string shortFile;
  allocator local_289;
  string local_288 [8];
  string fileContent;
  undefined1 local_250 [8];
  Field itr_1;
  iterator __end2;
  iterator __begin2;
  vector<Field,_std::allocator<Field>_> *__range2;
  Class cls;
  string scope;
  undefined1 local_158 [8];
  Class itr;
  iterator __end1;
  iterator __begin1;
  vector<Class,_std::allocator<Class>_> *__range1;
  ClassBundle cb;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string local_50 [32];
  string local_30 [8];
  string content;
  string *file_local;
  
  ReadFromFile(local_30);
  EraseComments(local_50);
  std::__cxx11::string::operator=((string *)local_30,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  GetWords((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&cb.unknownClasses._M_t._M_impl.super__Rb_tree_header._M_node_count,local_30);
  ParseClasses((ClassBundle *)&__range1,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cb.unknownClasses._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ClassBundle::upgradeScopes((ClassBundle *)&__range1);
  std::operator<<((ostream *)&std::cout,"+-+-+-+-+-+-+-+-+-+-+-+-+-+\n");
  std::operator<<((ostream *)&std::cout,"Found the following classes\n");
  __end1 = std::vector<Class,_std::allocator<Class>_>::begin
                     ((vector<Class,_std::allocator<Class>_> *)&__range1);
  itr._120_8_ = std::vector<Class,_std::allocator<Class>_>::end
                          ((vector<Class,_std::allocator<Class>_> *)&__range1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>
                                *)&itr.isEnum);
    if (!bVar2) break;
    pCVar8 = __gnu_cxx::__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>::
             operator*(&__end1);
    Class::Class((Class *)local_158,pCVar8);
    std::__cxx11::string::string((string *)&cls.isEnum,(string *)&itr.field_0x18);
    Class::Class((Class *)&__range2,(Class *)local_158);
    poVar10 = std::operator<<((ostream *)&std::cout,"Name:\t");
    poVar10 = std::operator<<(poVar10,(string *)&cls.field_0x38);
    std::operator<<(poVar10,'\n');
    poVar10 = std::operator<<((ostream *)&std::cout,"Scope:\t");
    poVar10 = std::operator<<(poVar10,(string *)&cls.field_0x18);
    std::operator<<(poVar10,'\n');
    std::operator<<((ostream *)&std::cout,"~~~~~~~\n");
    __end2 = std::vector<Field,_std::allocator<Field>_>::begin
                       ((vector<Field,_std::allocator<Field>_> *)&cls.field_0x58);
    itr_1._56_8_ = std::vector<Field,_std::allocator<Field>_>::end
                             ((vector<Field,_std::allocator<Field>_> *)&cls.field_0x58);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_>
                                  *)&itr_1.field_0x38);
      if (!bVar2) break;
      pFVar4 = __gnu_cxx::__normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_>::
               operator*(&__end2);
      Field::Field((Field *)local_250,pFVar4);
      poVar10 = std::operator<<((ostream *)&std::cout,"\t");
      poVar10 = std::operator<<(poVar10,(string *)local_250);
      poVar10 = std::operator<<(poVar10,'\t');
      poVar10 = std::operator<<(poVar10,(string *)&itr_1.field_0x18);
      std::operator<<(poVar10,'\n');
      Field::~Field((Field *)local_250);
      __gnu_cxx::__normal_iterator<Field_*,_std::vector<Field,_std::allocator<Field>_>_>::operator++
                (&__end2);
    }
    std::operator<<((ostream *)&std::cout,"<--------->\n\n\n");
    Class::~Class((Class *)&__range2);
    std::__cxx11::string::~string((string *)&cls.isEnum);
    Class::~Class((Class *)local_158);
    __gnu_cxx::__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>::operator++
              (&__end1);
  }
  iVar5 = std::vector<Class,_std::allocator<Class>_>::begin
                    ((vector<Class,_std::allocator<Class>_> *)&__range1);
  iVar6 = std::vector<Class,_std::allocator<Class>_>::end
                    ((vector<Class,_std::allocator<Class>_> *)&__range1);
  std::
  sort<__gnu_cxx::__normal_iterator<Class*,std::vector<Class,std::allocator<Class>>>,SolveFile(std::__cxx11::string_const&)::__0>
            (iVar5._M_current,iVar6._M_current);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"",&local_289);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  std::__cxx11::string::string((string *)&i,(string *)file);
  local_2b4 = 0;
  local_2b8 = 0;
  while( true ) {
    iVar1 = local_2b8;
    iVar3 = std::__cxx11::string::size();
    if (iVar3 <= iVar1) break;
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)file);
    if (*pcVar7 == '/') {
      local_2b4 = local_2b8;
    }
    local_2b8 = local_2b8 + 1;
  }
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)&__range1_1,(ulong)file);
  std::operator+((char *)local_2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"#include \"")
  ;
  std::operator+(local_2d8,(char *)local_2f8);
  std::__cxx11::string::operator+=(local_288,(string *)local_2d8);
  std::__cxx11::string::~string((string *)local_2d8);
  std::__cxx11::string::~string(local_2f8);
  std::__cxx11::string::~string((string *)&__range1_1);
  std::__cxx11::string::~string((string *)&i);
  __end1_1 = std::vector<Class,_std::allocator<Class>_>::begin
                       ((vector<Class,_std::allocator<Class>_> *)&__range1);
  itr_2._120_8_ =
       std::vector<Class,_std::allocator<Class>_>::end
                 ((vector<Class,_std::allocator<Class>_> *)&__range1);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_> *)
                       &itr_2.isEnum);
    if (!bVar2) break;
    pCVar8 = __gnu_cxx::__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>::
             operator*(&__end1_1);
    Class::Class((Class *)(local_3d0 + 0x20),pCVar8);
    Class::Class(&local_450,(Class *)(local_3d0 + 0x20));
    JSONifyClass_abi_cxx11_((Class *)local_3d0);
    std::__cxx11::string::operator+=(local_288,(string *)local_3d0);
    std::__cxx11::string::~string((string *)local_3d0);
    Class::~Class(&local_450);
    Class::~Class((Class *)(local_3d0 + 0x20));
    __gnu_cxx::__normal_iterator<Class_*,_std::vector<Class,_std::allocator<Class>_>_>::operator++
              (&__end1_1);
  }
  std::__cxx11::string::string(local_470,(string *)file);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"",&local_491);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  do {
    lVar9 = std::__cxx11::string::size();
    if (lVar9 == 0) {
LAB_00114ea9:
      std::__cxx11::string::operator+=(local_470,"JSONImpl");
      __first._M_current = (char *)std::__cxx11::string::begin();
      __last._M_current = (char *)std::__cxx11::string::end();
      std::reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__first,__last);
      std::__cxx11::string::operator+=(local_470,local_490);
      std::ofstream::ofstream(local_6a8,local_470,_S_out);
      poVar10 = std::operator<<(local_6a8,local_288);
      std::operator<<(poVar10,'\n');
      std::ofstream::close();
      std::ofstream::~ofstream(local_6a8);
      std::__cxx11::string::~string(local_490);
      std::__cxx11::string::~string(local_470);
      std::__cxx11::string::~string(local_288);
      ClassBundle::~ClassBundle((ClassBundle *)&__range1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&cb.unknownClasses._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)local_30);
      return;
    }
    pcVar7 = (char *)std::__cxx11::string::back();
    std::__cxx11::string::operator+=(local_490,*pcVar7);
    pcVar7 = (char *)std::__cxx11::string::back();
    if (*pcVar7 == '.') {
      std::__cxx11::string::pop_back();
      goto LAB_00114ea9;
    }
    std::__cxx11::string::pop_back();
  } while( true );
}

Assistant:

void SolveFile(const string& file) {
    auto content = ReadFromFile(file);
/*
    cerr << "~~~~~~~~~~~~~~~~~~~~~~\n";
    cerr << EraseComments(content) << '\n';
    cerr << "~~~~~~~~~~~~~~~~~~~~~~\n";
    cerr << "\n\n\n\n\n\n\n";
*/
    content = EraseComments(content);
    auto words = GetWords(content);
    ClassBundle cb = ParseClasses(words);

    cb.upgradeScopes();

    cout << "+-+-+-+-+-+-+-+-+-+-+-+-+-+\n";
    cout << "Found the following classes\n";
    for (auto itr : cb.allClasses) {
        auto scope = itr.scope;
        auto cls = itr;
        cout << "Name:\t" << cls.name << '\n';
        cout << "Scope:\t" << cls.scope << '\n';
        cout << "~~~~~~~\n";
        for (auto itr : cls.fields) {
            cout << "\t" << itr.type << '\t' << itr.name << '\n';
        }
        cout << "<--------->\n\n\n";
    }

    sort(cb.allClasses.begin(), cb.allClasses.end(), [](const auto& a, const auto& b) { return a.scope.size() > b.scope.size(); });
    string fileContent = "";

    {
        std::string shortFile = file;
        int start = 0;

        for (int i = 0; i < (int)file.size(); i += 1) {
            if (file[i] == '/') {
                start = i;
            }
        }

        fileContent += "#include \"" + file.substr(start, file.size()) + "\"\n"
                        "#include <JSON>\n\n";
    }

    for (auto itr : cb.allClasses) {
        fileContent += JSONifyClass(itr);
    }

    string finalFile = file;
    string remainingFile = "";

    while (finalFile.size()) {
        remainingFile += finalFile.back();
        if (finalFile.back() == '.') {
            finalFile.pop_back();
            break;
        }

        finalFile.pop_back();
    }

    finalFile += "JSONImpl";
    reverse(remainingFile.begin(), remainingFile.end());
    finalFile += remainingFile;

    ofstream fout(finalFile);
    fout << fileContent << '\n';
    fout.close();
}